

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.nalg.c
# Opt level: O0

void pnga_dot(int Type,Integer g_a,Integer g_b,void *value)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  Integer grp;
  Integer IVar6;
  Integer IVar7;
  logical lVar8;
  long lVar9;
  void *x;
  double *in_RCX;
  Integer in_RDX;
  Integer in_RSI;
  int in_EDI;
  Integer *in_stack_00000008;
  Integer *in_stack_00000010;
  Integer in_stack_00000018;
  Integer in_stack_00000020;
  SingleComplex b_1;
  SingleComplex a_1;
  DoubleComplex b;
  DoubleComplex a;
  int _i_3;
  int _i_2;
  int _i_1;
  int _i;
  Integer bdims [7];
  Integer bndim;
  Integer adims [7];
  Integer andim;
  Integer _hi [7];
  Integer _lo [7];
  Integer _ld [6];
  Integer _dims [7];
  Integer num_blocks_b;
  Integer num_blocks_a;
  Integer b_grp;
  Integer a_grp;
  int alen;
  void *ptr_b;
  void *ptr_a;
  float fsum;
  SingleComplex csum;
  DoubleComplex zsum;
  longlong llsum;
  long lsum;
  int isum;
  Integer i;
  Integer elemsb;
  Integer elems;
  Integer me;
  Integer atype;
  Integer type;
  Integer ndim;
  char *in_stack_00000678;
  Integer in_stack_00000680;
  Integer *in_stack_00000688;
  Integer *in_stack_00000690;
  char *in_stack_00000698;
  Integer in_stack_000006a0;
  Integer *in_stack_000006b0;
  Integer *in_stack_000006b8;
  void *in_stack_000006c0;
  ARMCI_Group *in_stack_fffffffffffffcf8;
  Integer in_stack_fffffffffffffd00;
  int type_00;
  char *in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd14;
  char *in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd24;
  float local_2c8;
  float fStack_2c4;
  float local_2c0;
  float fStack_2bc;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  Integer local_1b8 [8];
  long local_178 [2];
  Integer in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  long local_138 [8];
  Integer *in_stack_ffffffffffffff08;
  Integer *in_stack_ffffffffffffff10;
  Integer *in_stack_ffffffffffffff18;
  Integer in_stack_ffffffffffffff20;
  float local_8c;
  float local_88;
  float fStack_84;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  float local_5c;
  long local_58;
  long local_50;
  long local_48;
  Integer local_40;
  undefined8 local_38;
  long local_30;
  long local_28;
  double *local_20;
  Integer local_18;
  Integer local_10;
  int local_4;
  
  local_28 = 0;
  local_30 = 0;
  local_38 = 0;
  local_40 = 0;
  local_48 = 0;
  local_50 = 0;
  local_58 = 0;
  local_5c = 0.0;
  local_68 = 0.0;
  local_70 = 0.0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  memset(&local_80,0,0x10);
  memset(&local_88,0,8);
  local_8c = 0.0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  grp = pnga_get_pgroup(local_10);
  IVar6 = pnga_get_pgroup(local_18);
  if (grp != IVar6) {
    pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  local_40 = pnga_pgroup_nodeid(grp);
  IVar6 = pnga_total_blocks(local_10);
  IVar7 = pnga_total_blocks(local_18);
  if ((IVar6 < 0) && (IVar7 < 0)) {
    lVar8 = pnga_compare_distr(adims[1],adims[0]);
    if (((lVar8 == 0) || (lVar8 = pnga_has_ghosts(local_10), lVar8 != 0)) ||
       (lVar8 = pnga_has_ghosts(local_18), lVar8 != 0)) {
      pnga_inquire(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
      pnga_inquire(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
      pnga_dot_patch(in_stack_000006a0,in_stack_00000698,in_stack_00000690,in_stack_00000688,
                     in_stack_00000680,in_stack_00000678,in_stack_000006b0,in_stack_000006b8,
                     in_stack_000006c0);
    }
    else {
      pnga_pgroup_sync(in_stack_fffffffffffffd00);
      pnga_inquire(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
      if (local_30 != local_4) {
        pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      }
      pnga_distribution(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
      if (0 < local_178[0]) {
        pnga_access_ptr(bdims[6],(Integer *)bdims[5],(Integer *)bdims[4],(void *)bdims[3],
                        (Integer *)bdims[2]);
        lVar8 = pnga_has_ghosts(local_10);
        if (lVar8 == 0) {
          local_240 = 0;
          local_48 = (local_178[local_28 + -9] - local_178[local_28 + -1]) + 1;
          for (; (long)local_240 < local_28 + -1; local_240 = local_240 + 1) {
            if (local_138[local_240] != (local_178[(long)local_240 + -8] - local_178[local_240]) + 1
               ) {
              pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
            }
            local_48 = ((local_178[(long)local_240 + -8] - local_178[local_240]) + 1) * local_48;
          }
        }
        else {
          local_23c = 0;
          local_48 = (local_178[local_28 + -9] - local_178[local_28 + -1]) + 1;
          for (; (long)local_23c < local_28 + -1; local_23c = local_23c + 1) {
            if (local_138[local_23c] < (local_178[(long)local_23c + -8] - local_178[local_23c]) + 1)
            {
              pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
            }
            local_48 = ((local_178[(long)local_23c + -8] - local_178[local_23c]) + 1) * local_48;
          }
        }
      }
      type_00 = (int)((ulong)in_stack_fffffffffffffd00 >> 0x20);
      if (local_10 == local_18) {
        local_50 = local_48;
      }
      else {
        pnga_inquire(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08);
        if (local_30 != local_4) {
          pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        }
        pnga_distribution(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
        type_00 = (int)((ulong)in_stack_fffffffffffffd00 >> 0x20);
        if (0 < local_178[0]) {
          pnga_access_ptr(bdims[6],(Integer *)bdims[5],(Integer *)bdims[4],(void *)bdims[3],
                          (Integer *)bdims[2]);
          lVar8 = pnga_has_ghosts(local_18);
          if (lVar8 == 0) {
            local_248 = 0;
            local_50 = (local_178[local_28 + -9] - local_178[local_28 + -1]) + 1;
            for (; type_00 = (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                (long)local_248 < local_28 + -1; local_248 = local_248 + 1) {
              if (local_138[local_248] !=
                  (local_178[(long)local_248 + -8] - local_178[local_248]) + 1) {
                pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
              }
              local_50 = ((local_178[(long)local_248 + -8] - local_178[local_248]) + 1) * local_50;
            }
          }
          else {
            local_244 = 0;
            local_50 = (local_178[local_28 + -9] - local_178[local_28 + -1]) + 1;
            for (; type_00 = (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                (long)local_244 < local_28 + -1; local_244 = local_244 + 1) {
              if (local_138[local_244] <
                  (local_178[(long)local_244 + -8] - local_178[local_244]) + 1) {
                pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
              }
              local_50 = ((local_178[(long)local_244 + -8] - local_178[local_244]) + 1) * local_50;
            }
          }
        }
      }
      if (local_48 != local_50) {
        pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      }
      lVar9 = local_30 + -0x3e9;
      switch(lVar9) {
      case 0:
        for (local_58 = 0; local_58 < local_48; local_58 = local_58 + 1) {
          local_5c = (float)(*(int *)(local_58 * 4) * *(int *)(local_58 * 4) + (int)local_5c);
        }
        *(float *)local_20 = local_5c;
        local_30 = 0x3e9;
        break;
      case 1:
        for (local_58 = 0; local_58 < local_48; local_58 = local_58 + 1) {
          local_68 = (double)(*(long *)(local_58 * 8) * *(long *)(local_58 * 8) + (long)local_68);
        }
        *local_20 = local_68;
        local_30 = 0x3ea;
        break;
      case 2:
        for (local_58 = 0; local_58 < local_48; local_58 = local_58 + 1) {
          local_8c = *(float *)(local_58 * 4) * *(float *)(local_58 * 4) + local_8c;
        }
        *(float *)local_20 = local_8c;
        local_30 = 0x3eb;
        break;
      case 3:
        for (local_58 = 0; local_58 < local_48; local_58 = local_58 + 1) {
          local_80 = *(double *)(local_58 * 8) * *(double *)(local_58 * 8) + local_80;
        }
        *local_20 = local_80;
        local_30 = 0x3ec;
        break;
      default:
        pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        break;
      case 5:
        for (local_58 = 0; local_58 < local_48; local_58 = local_58 + 1) {
          local_2c0 = (float)*(undefined8 *)(local_58 * 8);
          local_2c8 = (float)*(undefined8 *)(local_58 * 8);
          fStack_2c4 = (float)((ulong)*(undefined8 *)(local_58 * 8) >> 0x20);
          fStack_2bc = (float)((ulong)*(undefined8 *)(local_58 * 8) >> 0x20);
          local_88 = local_2c0 * local_2c8 + -(fStack_2c4 * fStack_2bc) + local_88;
          fStack_84 = fStack_2bc * local_2c8 + fStack_2c4 * local_2c0 + fStack_84;
        }
        *local_20 = (double)CONCAT44(fStack_84,local_88);
        local_30 = 0x3ee;
        break;
      case 6:
        for (local_58 = 0; local_58 < local_48; local_58 = local_58 + 1) {
          dVar1 = *(double *)(local_58 * 0x10);
          dVar2 = ((double *)(local_58 * 0x10))[1];
          dVar3 = *(double *)(local_58 * 0x10);
          dVar4 = ((double *)(local_58 * 0x10))[1];
          local_80 = dVar1 * dVar3 + -(dVar4 * dVar2) + local_80;
          local_78 = dVar2 * dVar3 + dVar4 * dVar1 + local_78;
        }
        *local_20 = local_80;
        local_20[1] = local_78;
        local_30 = 0x3ef;
        break;
      case 0xf:
        for (local_58 = 0; local_58 < local_48; local_58 = local_58 + 1) {
          local_70 = (double)(*(long *)(local_58 * 8) * *(long *)(local_58 * 8) + (long)local_70);
        }
        *local_20 = local_70;
        local_30 = 0x3f8;
      }
      iVar5 = (int)((ulong)lVar9 >> 0x20);
      if ((0 < local_48) && (pnga_release(local_10,local_178,local_1b8), local_10 != local_18)) {
        pnga_release(local_18,local_178,local_1b8);
      }
      x = (void *)(local_30 + -0x3e9);
      switch(x) {
      case (void *)0x0:
        local_38 = 0xffffffffffffff9d;
        break;
      case (void *)0x1:
        local_38 = 0xffffffffffffff9b;
        break;
      case (void *)0x2:
        local_38 = 0xfffffffffffffece;
        break;
      case (void *)0x3:
        local_38 = 0xfffffffffffffecd;
        break;
      default:
        pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        break;
      case (void *)0x5:
        local_38 = 0xfffffffffffffece;
        break;
      case (void *)0x6:
        local_38 = 0xfffffffffffffecd;
        break;
      case (void *)0xf:
        local_38 = 0xffffffffffffff9a;
      }
      lVar8 = pnga_is_mirrored(local_10);
      if ((lVar8 == 0) || (lVar8 = pnga_is_mirrored(local_18), lVar8 == 0)) {
        if (grp == -1) {
          armci_msg_gop_scope(iVar5,x,in_stack_fffffffffffffd24,in_stack_fffffffffffffd18,
                              in_stack_fffffffffffffd14);
        }
        else {
          iVar5 = (int)local_38;
          ga_get_armci_group_((int)grp);
          armci_msg_group_gop_scope
                    (iVar5,local_20,in_stack_fffffffffffffd14,in_stack_fffffffffffffd08,type_00,
                     in_stack_fffffffffffffcf8);
        }
      }
      else {
        armci_msg_gop_scope(iVar5,x,in_stack_fffffffffffffd24,in_stack_fffffffffffffd18,
                            in_stack_fffffffffffffd14);
      }
    }
  }
  else {
    pnga_inquire(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08);
    pnga_inquire(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08);
    pnga_dot_patch(in_stack_000006a0,in_stack_00000698,in_stack_00000690,in_stack_00000688,
                   in_stack_00000680,in_stack_00000678,in_stack_000006b0,in_stack_000006b8,
                   in_stack_000006c0);
  }
  return;
}

Assistant:

void pnga_dot(int Type, Integer g_a, Integer g_b, void *value)
{
Integer  ndim=0, type=0, atype=0, me=0, elems=0, elemsb=0;
register Integer i=0;
int isum=0;
long lsum=0;
long long llsum=0;
DoubleComplex zsum ={0.,0.};
SingleComplex csum ={0.,0.};
float fsum=0.0;
void *ptr_a=NULL, *ptr_b=NULL;
int alen=0;
Integer a_grp=0, b_grp=0;
Integer num_blocks_a=0, num_blocks_b=0;

Integer _dims[MAXDIM];
Integer _ld[MAXDIM-1];
Integer _lo[MAXDIM];
Integer _hi[MAXDIM];
Integer andim, adims[MAXDIM];
Integer bndim, bdims[MAXDIM];

   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/

   a_grp = pnga_get_pgroup(g_a);
   b_grp = pnga_get_pgroup(g_b);
   if (a_grp != b_grp)
     pnga_error("Both arrays must be defined on same group",0L);
   me = pnga_pgroup_nodeid(a_grp);

   /* Check to see if either GA is block cyclic distributed */
   num_blocks_a = pnga_total_blocks(g_a);
   num_blocks_b = pnga_total_blocks(g_b);
   if (num_blocks_a >= 0 || num_blocks_b >= 0) {
     pnga_inquire(g_a, &type, &andim, adims);
     pnga_inquire(g_b, &type, &bndim, bdims);
     pnga_dot_patch(g_a, "n", one_arr, adims, g_b, "n", one_arr, bdims,
         value);
     return;
   }

   if(pnga_compare_distr(g_a,g_b) == FALSE ||
      pnga_has_ghosts(g_a) || pnga_has_ghosts(g_b)) {
       /* distributions not identical */
       pnga_inquire(g_a, &type, &andim, adims);
       pnga_inquire(g_b, &type, &bndim, bdims);

       pnga_dot_patch(g_a, "n", one_arr, adims, g_b, "n", one_arr, bdims,
                      value);
       
       return;
   }
   
   pnga_pgroup_sync(a_grp);
   pnga_inquire(g_a,  &type, &ndim, _dims);
   if(type != Type) pnga_error("type not correct", g_a);
   pnga_distribution(g_a, me, _lo, _hi);
   if(_lo[0]>0){
      pnga_access_ptr(g_a, _lo, _hi, &ptr_a, _ld);
      if (pnga_has_ghosts(g_a)) {
        GET_ELEMS_W_GHOSTS(ndim,_lo,_hi,_ld,&elems);
      } else {
        GET_ELEMS(ndim,_lo,_hi,_ld,&elems);
      }
   }

   if(g_a == g_b){
     elemsb = elems;
     ptr_b = ptr_a;
   }else {  
     pnga_inquire(g_b,  &type, &ndim, _dims);
     if(type != Type) pnga_error("type not correct", g_b);
     pnga_distribution(g_b, me, _lo, _hi);
     if(_lo[0]>0){
        pnga_access_ptr(g_b, _lo, _hi, &ptr_b, _ld);
        if (pnga_has_ghosts(g_b)) {
          GET_ELEMS_W_GHOSTS(ndim,_lo,_hi,_ld,&elemsb);
        } else {
          GET_ELEMS(ndim,_lo,_hi,_ld,&elemsb);
        }
     }
   }

   if(elems!= elemsb)pnga_error("inconsistent number of elements",elems-elemsb); 


      /* compute "local" contribution to the dot product */
      switch (type){
	int *ia, *ib;
	double *da,*db;
        float *fa, *fb;
        long *la,*lb;
        long long *lla,*llb;
        case C_INT:
           ia = (int*)ptr_a;
           ib = (int*)ptr_b;
           for(i=0;i<elems;i++) 
                 isum += ia[i]  * ib[i];
           *(int*)value = isum; 
           type = C_INT;
           alen = 1;
           break;

        case C_DCPL:
           for(i=0;i<elems;i++){
               DoubleComplex a = ((DoubleComplex*)ptr_a)[i];
               DoubleComplex b = ((DoubleComplex*)ptr_b)[i];
               zsum.real += a.real*b.real  - b.imag * a.imag;
               zsum.imag += a.imag*b.real  + b.imag * a.real;
           }
           *(DoubleComplex*)value = zsum; 
           type = C_DCPL;
           alen = 2;
           break;

        case C_SCPL:
           for(i=0;i<elems;i++){
               SingleComplex a = ((SingleComplex*)ptr_a)[i];
               SingleComplex b = ((SingleComplex*)ptr_b)[i];
               csum.real += a.real*b.real  - b.imag * a.imag;
               csum.imag += a.imag*b.real  + b.imag * a.real;
           }
           *(SingleComplex*)value = csum; 
           type = C_SCPL;
           alen = 2;
           break;

        case C_DBL:
           da = (double*)ptr_a;
           db = (double*)ptr_b;
           for(i=0;i<elems;i++) 
                 zsum.real += da[i]  * db[i];
           *(double*)value = zsum.real; 
           type = C_DBL;
           alen = 1;
           break;
        case C_FLOAT:
           fa = (float*)ptr_a;
           fb = (float*)ptr_b;
           for(i=0;i<elems;i++)
                 fsum += fa[i]  * fb[i];
           *(float*)value = fsum;
           type = C_FLOAT;
           alen = 1;
           break;         
        case C_LONG:
           la = (long*)ptr_a;
           lb = (long*)ptr_b;
           for(i=0;i<elems;i++)
		lsum += la[i]  * lb[i];
           *(long*)value = lsum;
           type = C_LONG;
           alen = 1;
           break;               
        case C_LONGLONG:
           lla = (long long*)ptr_a;
           llb = (long long*)ptr_b;
           for(i=0;i<elems;i++)
		llsum += lla[i]  * llb[i];
           *(long long*)value = llsum;
           type = C_LONGLONG;
           alen = 1;
           break;               
        default: pnga_error(" wrong data type ",type);
      }
   
      /* release access to the data */
      if(elems>0){
         pnga_release(g_a, _lo, _hi);
         if(g_a != g_b)pnga_release(g_b, _lo, _hi);
      }

    /*convert from C data type to ARMCI type */
    switch(type) {
      case C_FLOAT: atype=ARMCI_FLOAT; break;
      case C_DBL: atype=ARMCI_DOUBLE; break;
      case C_INT: atype=ARMCI_INT; break;
      case C_LONG: atype=ARMCI_LONG; break;
      case C_LONGLONG: atype=ARMCI_LONG_LONG; break;
      case C_DCPL: atype=ARMCI_DOUBLE; break;
      case C_SCPL: atype=ARMCI_FLOAT; break;
      default: pnga_error("pnga_dot: type not supported",type);
    }

   if (pnga_is_mirrored(g_a) && pnga_is_mirrored(g_b)) {
     armci_msg_gop_scope(SCOPE_NODE,value,alen,"+",atype);
   } else {
     if (a_grp == -1) {
       armci_msg_gop_scope(SCOPE_ALL,value,alen,"+",atype);
#ifdef MSG_COMMS_MPI
     } else {
       armci_msg_group_gop_scope(SCOPE_ALL,value,alen,"+",atype,
           ga_get_armci_group_((int)a_grp));
#endif
     }
   }
    

}